

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O0

void duckdb::
     LeastGreatestFunction<duckdb::hugeint_t,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  uint64_t uVar1;
  int64_t iVar2;
  ulong uVar3;
  VectorType VVar4;
  bool bVar5;
  idx_t iVar6;
  reference pvVar7;
  UnifiedVectorFormat *pUVar8;
  hugeint_t *phVar9;
  Vector *pVVar10;
  hugeint_t *phVar11;
  Vector *in_RDX;
  ExpressionState *in_RSI;
  DataChunk *in_RDI;
  hugeint_t ivalue_1;
  idx_t vindex_1;
  idx_t i_1;
  hugeint_t ivalue;
  idx_t vindex;
  idx_t i;
  hugeint_t *input_data;
  UnifiedVectorFormat vdata;
  idx_t col_idx_1;
  bool result_has_value [2048];
  hugeint_t *result_data;
  idx_t col_idx;
  VectorType result_type;
  Vector *result_vector;
  DataChunk *input;
  undefined7 in_stack_fffffffffffff6c8;
  undefined1 in_stack_fffffffffffff6cf;
  hugeint_t *in_stack_fffffffffffff6d0;
  undefined6 in_stack_fffffffffffff6d8;
  undefined1 in_stack_fffffffffffff6de;
  undefined1 in_stack_fffffffffffff6df;
  Vector *in_stack_fffffffffffff6e0;
  hugeint_t *in_stack_fffffffffffff6e8;
  reference in_stack_fffffffffffff6f0;
  hugeint_t *local_8d8;
  Vector *local_8b8;
  SelectionVector *local_898 [2];
  TemplatedValidityMask<unsigned_long> local_888;
  ulong local_850;
  Vector local_848 [2056];
  hugeint_t *local_40;
  ulong local_38;
  undefined1 local_29;
  Vector *local_28;
  DataChunk *local_20;
  Vector *local_18;
  ExpressionState *local_10;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar6 = DataChunk::ColumnCount((DataChunk *)0xd39ccc);
  if (iVar6 == 1) {
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff6d0,
               CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8));
    duckdb::Vector::Reference(local_18);
  }
  else {
    local_20 = StandardLeastGreatest<false>::Prepare(local_8,local_10);
    local_28 = StandardLeastGreatest<false>::TargetVector(local_18,local_10);
    local_29 = 2;
    for (local_38 = 0; uVar3 = local_38, iVar6 = DataChunk::ColumnCount((DataChunk *)0xd39d6a),
        uVar3 < iVar6; local_38 = local_38 + 1) {
      pvVar7 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff6d0,
                          CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8));
      VVar4 = Vector::GetVectorType(pvVar7);
      if (VVar4 != CONSTANT_VECTOR) {
        local_29 = 0;
      }
    }
    local_40 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0xd39dc5);
    memset(local_848,0,0x800);
    local_850 = 0;
    while( true ) {
      uVar3 = local_850;
      iVar6 = DataChunk::ColumnCount((DataChunk *)0xd39e07);
      if (iVar6 <= uVar3) break;
      pvVar7 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff6d0,
                          CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8));
      VVar4 = Vector::GetVectorType(pvVar7);
      if (VVar4 == CONSTANT_VECTOR) {
        vector<duckdb::Vector,_true>::operator[]
                  ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff6d0,
                   CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8));
        bVar5 = ConstantVector::IsNull((Vector *)0xd39e56);
        if (!bVar5) goto LAB_00d39e61;
      }
      else {
LAB_00d39e61:
        duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_898);
        in_stack_fffffffffffff6f0 =
             vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff6d0,
                        CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8));
        pUVar8 = (UnifiedVectorFormat *)DataChunk::size(local_20);
        duckdb::Vector::ToUnifiedFormat((ulong)in_stack_fffffffffffff6f0,pUVar8);
        phVar9 = UnifiedVectorFormat::GetData<duckdb::hugeint_t>((UnifiedVectorFormat *)local_898);
        in_stack_fffffffffffff6e8 = phVar9;
        bVar5 = TemplatedValidityMask<unsigned_long>::AllValid(&local_888);
        if (bVar5) {
          local_8d8 = (hugeint_t *)0x0;
          while (in_stack_fffffffffffff6d0 = local_8d8,
                phVar11 = (hugeint_t *)DataChunk::size(local_20),
                in_stack_fffffffffffff6d0 < phVar11) {
            iVar6 = SelectionVector::get_index(local_898[0],(idx_t)local_8d8);
            uVar1 = phVar9[iVar6].lower;
            iVar2 = phVar9[iVar6].upper;
            if ((((byte)local_848[(long)local_8d8] & 1) == 0) ||
               (in_stack_fffffffffffff6cf =
                     LessThan::Operation<duckdb::hugeint_t>
                               (in_stack_fffffffffffff6d0,
                                (hugeint_t *)
                                CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8)),
               (bool)in_stack_fffffffffffff6cf)) {
              local_848[(long)local_8d8] = (Vector)0x1;
              local_40[(long)local_8d8].lower = uVar1;
              local_40[(long)local_8d8].upper = iVar2;
            }
            local_8d8 = (hugeint_t *)((long)&local_8d8->lower + 1);
          }
        }
        else {
          local_8b8 = (Vector *)0x0;
          while (in_stack_fffffffffffff6e0 = local_8b8,
                pVVar10 = (Vector *)DataChunk::size(local_20), in_stack_fffffffffffff6e0 < pVVar10)
          {
            iVar6 = SelectionVector::get_index(local_898[0],(idx_t)local_8b8);
            in_stack_fffffffffffff6df =
                 TemplatedValidityMask<unsigned_long>::RowIsValid
                           ((TemplatedValidityMask<unsigned_long> *)
                            CONCAT17(in_stack_fffffffffffff6df,
                                     CONCAT16(in_stack_fffffffffffff6de,in_stack_fffffffffffff6d8)),
                            (idx_t)in_stack_fffffffffffff6d0);
            if ((bool)in_stack_fffffffffffff6df) {
              uVar1 = phVar9[iVar6].lower;
              iVar2 = phVar9[iVar6].upper;
              if ((((byte)local_848[(long)local_8b8] & 1) == 0) ||
                 (in_stack_fffffffffffff6de =
                       LessThan::Operation<duckdb::hugeint_t>
                                 (in_stack_fffffffffffff6d0,
                                  (hugeint_t *)
                                  CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8)),
                 (bool)in_stack_fffffffffffff6de)) {
                local_848[(long)local_8b8] = (Vector)0x1;
                local_40[(long)local_8b8].lower = uVar1;
                local_40[(long)local_8b8].upper = iVar2;
              }
            }
            local_8b8 = local_8b8 + 1;
          }
        }
        UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffff6d0);
      }
      local_850 = local_850 + 1;
    }
    DataChunk::size(local_20);
    StandardLeastGreatest<false>::FinalizeResult
              ((idx_t)in_stack_fffffffffffff6f0,(bool *)in_stack_fffffffffffff6e8,
               in_stack_fffffffffffff6e0,
               (ExpressionState *)
               CONCAT17(in_stack_fffffffffffff6df,
                        CONCAT16(in_stack_fffffffffffff6de,in_stack_fffffffffffff6d8)));
    duckdb::Vector::SetVectorType((VectorType)local_18);
  }
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}